

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::RuntimeImp::enqueue(RuntimeImp *this,Thread *thread)

{
  iterator *piVar1;
  __atomic_flag_data_type _Var2;
  _Elt_pointer ppTVar3;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  Thread *thread_local;
  
  lock._8_8_ = thread;
  if (this->multiThread == true) {
    local_30 = (undefined1  [8])&this->mtQueue;
    lock._M_device._0_1_ = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
    lock._M_device._0_1_ = 1;
    ppTVar3 = (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar3 ==
        (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl
        .super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<chatra::Thread*,std::allocator<chatra::Thread*>>::
      _M_push_back_aux<chatra::Thread*const&>
                ((deque<chatra::Thread*,std::allocator<chatra::Thread*>> *)&this->queue,
                 (Thread **)&lock._M_owns);
    }
    else {
      *ppTVar3 = (Thread *)lock._8_8_;
      piVar1 = &(this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  }
  else {
    do {
      LOCK();
      _Var2 = (this->lockQueue).flag.super___atomic_flag_base._M_i;
      (this->lockQueue).flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var2 != false);
    ppTVar3 = (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar3 ==
        (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl
        .super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<chatra::Thread*,std::allocator<chatra::Thread*>>::
      _M_push_back_aux<chatra::Thread*const&>
                ((deque<chatra::Thread*,std::allocator<chatra::Thread*>> *)&this->queue,
                 (Thread **)&lock._M_owns);
    }
    else {
      *ppTVar3 = thread;
      piVar1 = &(this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    (this->lockQueue).flag.super___atomic_flag_base._M_i = false;
  }
  return;
}

Assistant:

void RuntimeImp::enqueue(Thread* thread) {
	chatra_assert(thread != nullptr);

	/*std::printf("enqueue: instanceId %u, threadId = %u; frames.size = %u\n",
			static_cast<unsigned>(thread->instance.getId()),
			static_cast<unsigned>(thread->getId()),
			static_cast<unsigned>(thread->frames.size()));
	std::fflush(stdout);*/

	/*{
		static unsigned count = 0;
		static constexpr unsigned breakCount = std::numeric_limits<unsigned>::max();  // std::numeric_limits<unsigned>::max()
		std::unique_lock<std::mutex> lock(mtQueue);
		count++;
		if (count == breakCount)
			chatra_assert(false);
		for (auto* t : queue)
			chatra_assert(t != thread);
	}*/

	if (multiThread) {
		std::unique_lock<std::mutex> lock(mtQueue);
		queue.push_back(thread);
		cvQueue.notify_one();
	}
	else {
		std::lock_guard<SpinLock> lock(lockQueue);
		queue.push_back(thread);
	}
}